

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O1

DdNode * extraZddSelectOneSubset(DdManager *dd,DdNode *zS)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *data;
  
  if (dd->zero == zS) {
    return dd->zero;
  }
  if (dd->one == zS) {
    return dd->one;
  }
  pDVar2 = cuddCacheLookup1Zdd(dd,extraZddSelectOneSubset,zS);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  pDVar2 = (zS->type).kids.E;
  if (pDVar2 == dd->zero) {
    pDVar2 = (zS->type).kids.T;
    if (pDVar2 == dd->zero) {
      __assert_fail("zS1 != z0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddSymm.c"
                    ,0x5a8,"DdNode *extraZddSelectOneSubset(DdManager *, DdNode *)");
    }
    pDVar2 = extraZddSelectOneSubset(dd,pDVar2);
    if (pDVar2 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      data = cuddZddGetNode(dd,zS->index,pDVar2,dd->zero);
      if (data != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        goto LAB_00807dc1;
      }
      Cudd_RecursiveDerefZdd(dd,pDVar2);
    }
  }
  else {
    data = extraZddSelectOneSubset(dd,pDVar2);
    if (data != (DdNode *)0x0) {
LAB_00807dc1:
      cuddCacheInsert1(dd,extraZddSelectOneSubset,zS,data);
      return data;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode * extraZddSelectOneSubset( 
  DdManager * dd, 
  DdNode * zS )
// selects one subset from the ZDD zS
// returns z0 if and only if zS is an empty set of cubes
{
    DdNode * zRes;

    if ( zS == z0 )    return z0;
    if ( zS == z1 )    return z1;
    
    // check cache
    if ( (zRes = cuddCacheLookup1Zdd( dd, extraZddSelectOneSubset, zS )) )
        return zRes;
    else
    {
        DdNode * zS0, * zS1, * zTemp; 

        zS0 = cuddE(zS);
        zS1 = cuddT(zS);

        if ( zS0 != z0 )
        {
            zRes = extraZddSelectOneSubset( dd, zS0 );
            if ( zRes == NULL )
                return NULL;
        }
        else // if ( zS0 == z0 )
        {
            assert( zS1 != z0 );
            zRes = extraZddSelectOneSubset( dd, zS1 );
            if ( zRes == NULL )
                return NULL;
            cuddRef( zRes );

            zRes = cuddZddGetNode( dd, zS->index, zTemp = zRes, z0 );
            if ( zRes == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                return NULL;
            }
            cuddDeref( zTemp );
        }

        // insert the result into cache
        cuddCacheInsert1( dd, extraZddSelectOneSubset, zS, zRes );
        return zRes;
    }       
}